

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O2

int test(char *URL)

{
  CURL **ppCVar1;
  uint __i;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  CURL *pCVar5;
  int *piVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  timeval tVar12;
  undefined8 uStack_300;
  int maxfd;
  int running;
  timeval interval;
  CURL *curl [4];
  fd_set wr;
  fd_set rd;
  fd_set exc;
  char target_url [256];
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    curl[lVar3] = (CURL *)0x0;
  }
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar10 = _stderr;
  if (iVar2 != 0) {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar10,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x2f,iVar2,uVar4);
    goto LAB_001026ed;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,0x31);
    iVar2 = 0x7b;
  }
  else {
    lVar11 = 0;
    do {
      if (lVar11 == 4) {
        iVar2 = curl_multi_add_handle(lVar3,curl[0]);
        uVar10 = _stderr;
        if (iVar2 != 0) {
          uVar4 = curl_multi_strerror(iVar2);
          pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_300 = 0x44;
          goto LAB_001026a9;
        }
        iVar2 = curl_multi_setopt(lVar3,3,1);
        uVar10 = _stderr;
        if (iVar2 == 0) {
          curl_mfprintf(_stderr,"Start at URL 0\n");
          uVar8 = 1;
          goto LAB_00102520;
        }
        uVar4 = curl_multi_strerror(iVar2);
        pcVar7 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x46;
        goto LAB_001026a9;
      }
      pCVar5 = (CURL *)curl_easy_init();
      curl[lVar11] = pCVar5;
      if (pCVar5 == (CURL *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                      ,0x36);
        iVar2 = 0x7c;
        goto LAB_001026ba;
      }
      curl_msnprintf(target_url,0x100,"%s%04i",URL,(int)lVar11 + 1);
      target_url[0xff] = '\0';
      iVar2 = curl_easy_setopt(pCVar5,0x2712,target_url);
      uVar10 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x3a;
        goto LAB_001026a9;
      }
      iVar2 = curl_easy_setopt(pCVar5,0x29,1);
      uVar10 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x3c;
        goto LAB_001026a9;
      }
      iVar2 = curl_easy_setopt(pCVar5,0x2a,1);
      uVar10 = _stderr;
      lVar11 = lVar11 + 1;
    } while (iVar2 == 0);
    uVar4 = curl_easy_strerror(iVar2);
    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    uStack_300 = 0x3e;
LAB_001026a9:
    curl_mfprintf(uVar10,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                  ,uStack_300,iVar2,uVar4);
  }
  goto LAB_001026ba;
  while( true ) {
    tVar12 = tutil_tvnow();
    lVar11 = tutil_tvdiff(tVar12,tv_test_start);
    if (60000 < lVar11) {
      uStack_300 = 0x54;
      goto LAB_001027db;
    }
    if (running == 0) {
      if (3 < uVar8) {
        iVar2 = 0;
        goto LAB_001026ba;
      }
      uVar9 = (ulong)uVar8;
      while (uVar9 != 4) {
        ppCVar1 = curl + uVar9;
        uVar9 = uVar9 + 1;
        iVar2 = curl_multi_add_handle(lVar3,*ppCVar1);
        uVar10 = _stderr;
        if (iVar2 != 0) {
          uVar4 = curl_multi_strerror(iVar2);
          pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_300 = 0x5d;
          goto LAB_001026a9;
        }
      }
      uVar8 = 4;
    }
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      rd.__fds_bits[lVar11] = 0;
    }
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      wr.__fds_bits[lVar11] = 0;
    }
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      exc.__fds_bits[lVar11] = 0;
    }
    iVar2 = curl_multi_fdset(lVar3,&rd,&wr,&exc,&maxfd);
    uVar10 = _stderr;
    if (iVar2 != 0) {
      uVar4 = curl_multi_strerror(iVar2);
      pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uStack_300 = 100;
      goto LAB_001026a9;
    }
    if (maxfd < -1) {
      pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uStack_300 = 100;
      goto LAB_00102780;
    }
    iVar2 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
    if (iVar2 == -1) {
      piVar6 = __errno_location();
      uVar10 = _stderr;
      iVar2 = *piVar6;
      pcVar7 = strerror(iVar2);
      curl_mfprintf(uVar10,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                    ,0x68,iVar2,pcVar7);
      iVar2 = 0x79;
      goto LAB_001026ba;
    }
    tVar12 = tutil_tvnow();
    lVar11 = tutil_tvdiff(tVar12,tv_test_start);
    if (60000 < lVar11) break;
LAB_00102520:
    maxfd = -99;
    interval.tv_sec = 1;
    interval.tv_usec = 0;
    iVar2 = curl_multi_perform(lVar3,&running);
    uVar10 = _stderr;
    if (iVar2 != 0) {
      uVar4 = curl_multi_strerror(iVar2);
      pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uStack_300 = 0x52;
      goto LAB_001026a9;
    }
    if (running < 0) {
      pcVar7 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uStack_300 = 0x52;
LAB_00102780:
      curl_mfprintf(_stderr,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                    ,uStack_300);
      iVar2 = 0x7a;
      goto LAB_001026ba;
    }
  }
  uStack_300 = 0x6a;
LAB_001027db:
  curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib530.c"
                ,uStack_300);
  iVar2 = 0x7d;
LAB_001026ba:
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    pCVar5 = curl[lVar11];
    curl_multi_remove_handle(lVar3,pCVar5);
    curl_easy_cleanup(pCVar5);
  }
  curl_multi_cleanup(lVar3);
  curl_global_cleanup();
LAB_001026ed:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  int handles_added = 0;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url), "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
  }

  /* Add the first handle to multi. We do this to let libcurl detect
     that the server can do pipelining. The rest of the handles will be
     added later. */
  multi_add_handle(m, curl[handles_added++]);

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(handles_added >= NUM_HANDLES)
        break; /* done */

      /* Add the rest of the handles now that the first handle has completed
         its request. */
      while(handles_added < NUM_HANDLES)
        multi_add_handle(m, curl[handles_added++]);
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}